

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void TPZTensor<TFad<6,_double>_>::TPZDecomposed::TangentCheckConv
               (TPZFMatrix<double> *state,TPZFMatrix<double> *tangent,int icase)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  ostream *poVar5;
  int i;
  long lVar6;
  int j;
  double local_300;
  TPZTensor<double> obj;
  TPZDecomposed objdec;
  
  TPZTensor<double>::TPZTensor(&obj);
  pdVar4 = state->fElem;
  for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
    obj.fData.super_TPZVec<double>.fStore[lVar6] = pdVar4[lVar6];
  }
  TPZTensor<double>::TPZDecomposed::TPZDecomposed(&objdec,&obj);
  if ((uint)icase < 3) {
    (*(tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
              (tangent,1,9);
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      gEigval[lVar6] = objdec.fEigenvalues.super_TPZVec<double>.fStore[lVar6];
    }
    for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
      dVar1 = objdec.fEigentensors.super_TPZVec<TPZTensor<double>_>.fStore[(uint)icase].fData.
              super_TPZVec<double>.fStore[lVar6];
      pdVar4 = TPZFMatrix<double>::operator()(tangent,0,lVar6);
      *pdVar4 = dVar1;
      dVar1 = objdec.fEigentensors.super_TPZVec<TPZTensor<double>_>.fStore[(uint)icase].fData.
              super_TPZVec<double>.fStore[1];
      pdVar4 = TPZFMatrix<double>::operator()(tangent,0,6);
      *pdVar4 = dVar1;
      dVar1 = objdec.fEigentensors.super_TPZVec<TPZTensor<double>_>.fStore[(uint)icase].fData.
              super_TPZVec<double>.fStore[2];
      pdVar4 = TPZFMatrix<double>::operator()(tangent,0,7);
      *pdVar4 = dVar1;
      dVar1 = objdec.fEigentensors.super_TPZVec<TPZTensor<double>_>.fStore[(uint)icase].fData.
              super_TPZVec<double>.fStore[4];
      pdVar4 = TPZFMatrix<double>::operator()(tangent,0,8);
      *pdVar4 = dVar1;
    }
    local_300 = 0.0;
    for (lVar6 = 0; lVar6 != 9; lVar6 = lVar6 + 1) {
      pdVar4 = TPZFMatrix<double>::operator()(tangent,0,lVar6);
      dVar1 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()(tangent,0,lVar6);
      local_300 = local_300 + dVar1 * *pdVar4;
    }
    pdVar4 = TPZFMatrix<double>::operator()(tangent,0,0);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(tangent,0,3);
    dVar2 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(tangent,0,5);
    dVar3 = *pdVar4;
    (*(tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x1c]
    )(tangent,"tangent",&std::cout,0);
    std::operator<<((ostream *)&std::cout,"sum2 = ");
    poVar5 = std::ostream::_M_insert<double>(dVar1 + dVar2 + dVar3);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::operator<<((ostream *)&std::cout,"sum = ");
    poVar5 = std::ostream::_M_insert<double>(local_300);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  TPZTensor<double>::TPZDecomposed::~TPZDecomposed(&objdec);
  TPZTensor<double>::~TPZTensor(&obj);
  return;
}

Assistant:

static void TangentCheckConv(TPZFMatrix<STATE> &state, TPZFMatrix<STATE> &tangent, int icase) {
            TPZTensor<STATE> obj;
            for (int i = 0; i < 6; i++) {
                obj[i] = state(i);
            }
            TPZTensor<STATE>::TPZDecomposed objdec(obj);
            switch (icase) {
                case 0:
                case 1:
                case 2:
                {
                    tangent.Resize(1, 9);
                    for (int i = 0; i < 3; i++) {
                        gEigval[i] = objdec.fEigenvalues[i];
                    }
                    for (int j = 0; j < 6; j++) {
                        tangent(0, j) = objdec.fEigentensors[icase][j];
                        tangent(0, 6) = objdec.fEigentensors[icase].XY();
                        tangent(0, 7) = objdec.fEigentensors[icase].XZ();
                        tangent(0, 8) = objdec.fEigentensors[icase].YZ();
                    }
                    STATE sum = 0., sum2 = 0.;
                    for (int i = 0; i < 9; i++) {
                        sum += tangent(0, i) * tangent(0, i);
                    }
                    sum2 = tangent(0, _XX_) + tangent(0, _YY_) + tangent(0, _ZZ_);
                    tangent.Print("tangent");
                    std::cout << "sum2 = " << sum2 << std::endl;
                    std::cout << "sum = " << sum << std::endl;
                }
                    break;
                default:
                    break;
            }
        }